

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

void __thiscall slang::ast::EvalContext::reportDiags(EvalContext *this,Diagnostics *diagSet)

{
  bool bVar1;
  SmallVectorBase<slang::Diagnostic> *in_RSI;
  long in_RDI;
  Diagnostic *in_stack_00000078;
  ASTContext *in_stack_00000080;
  Diagnostics *in_stack_00000108;
  Scope *in_stack_00000110;
  
  bVar1 = SmallVectorBase<slang::Diagnostic>::empty(in_RSI);
  if (!bVar1) {
    if ((*(long *)(in_RDI + 0x30) != 0) && ((*(byte *)(in_RDI + 0x348) & 1) == 0)) {
      SmallVectorBase<slang::Diagnostic>::operator[](in_RSI,0);
      ASTContext::addAssertionBacktrace(in_stack_00000080,in_stack_00000078);
      *(undefined1 *)(in_RDI + 0x348) = 1;
    }
    not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x6f31fb)
    ;
    Scope::addDiags(in_stack_00000110,in_stack_00000108);
    SmallVectorBase<slang::Diagnostic>::clear(in_RSI);
  }
  return;
}

Assistant:

void EvalContext::reportDiags(Diagnostics& diagSet) {
    if (!diagSet.empty()) {
        if (astCtx.assertionInstance && !backtraceReported) {
            astCtx.addAssertionBacktrace(diagSet[0]);
            backtraceReported = true;
        }

        astCtx.scope->addDiags(diagSet);
        diagSet.clear();
    }
}